

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sx_split(char *dest1,int dest1_sz,char *dest2,int dest2_sz,char *src,char splitch)

{
  char *pcVar1;
  char *sptr;
  char splitch_local;
  char *src_local;
  int dest2_sz_local;
  char *dest2_local;
  int dest1_sz_local;
  char *dest1_local;
  
  pcVar1 = sx_strchar(src,splitch);
  if (pcVar1 != (char *)0x0) {
    sx_strncpy(dest1,dest1_sz,src,(int)pcVar1 - (int)src);
    sx_strcpy(dest2,dest2_sz,src + 1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool sx_split(char* dest1, int dest1_sz, char* dest2, int dest2_sz, const char* src, char splitch)
{
    const char* sptr = sx_strchar(src, splitch);
    if (sptr) {
        sx_strncpy(dest1, dest1_sz, src, (int)(uintptr_t)(sptr - src));
        sx_strcpy(dest2, dest2_sz, src + 1);
        return true;
    }

    return false;
}